

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  char cVar1;
  undefined8 uVar2;
  EnumType lIndex;
  ushort local_2a;
  Logger *local_28;
  ushort *puStack_20;
  code *local_18;
  code *pcStack_10;
  
  puStack_20 = &local_2a;
  local_2a = 2;
  pcStack_10 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
             ::_M_manager;
  local_28 = this;
  do {
    if (local_18 == (code *)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    cVar1 = (*pcStack_10)(&local_28);
  } while ((cVar1 == '\0') && (local_2a = local_2a * 2, local_2a < 0x81));
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void resolveLoggerFormatSpec(void) const {
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            base::LogFormat* logFormat = 
                const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
            base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
            return false;
        });
    }